

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClusterList.h
# Opt level: O2

void __thiscall
SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U>::CreateBacking
          (SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *this,uint index)

{
  long lVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  void *pvVar5;
  ulong uVar6;
  uint i;
  long lVar7;
  
  if (index < this->maxIndex) {
    uVar6 = (ulong)(index >> 4);
    if (this->backingStore[uVar6] != (uint *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ClusterList.h"
                         ,0xc4,
                         "(index >= maxIndex || backingStore[index / numPerSegment] == nullptr)",
                         "index >= maxIndex || backingStore[index / numPerSegment] == nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
  }
  else {
    uVar6 = (ulong)(index >> 4);
  }
  EnsureBaseSize(this,index);
  if (this->backingStore[uVar6] == (uint *)0x0) {
    pvVar5 = new__<Memory::JitArenaAllocator>(0x40,this->alloc,0x3dbab4);
    uVar6 = (ulong)(uint)((int)uVar6 << 3);
    *(void **)((long)this->backingStore + uVar6) = pvVar5;
    lVar1 = *(long *)((long)this->backingStore + uVar6);
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      *(uint *)(lVar1 + lVar7 * 4) = index & 0xfffffff0 | (uint)lVar7;
    }
  }
  return;
}

Assistant:

inline void CreateBacking(indexType index)
    {
        Assert(index >= maxIndex || backingStore[index / numPerSegment] == nullptr);
        // grow the size of the pointer array if needed
        EnsureBaseSize(index);
        if (backingStore[index / numPerSegment] == nullptr)
        {
            // allocate a new segment
            backingStore[index / numPerSegment] = AllocatorNewArrayLeaf(TAllocator, alloc, indexType, numPerSegment);
            indexType baseForSegment = (index / numPerSegment) * numPerSegment;
            for (indexType i = 0; i < numPerSegment; i++)
            {
                backingStore[index / numPerSegment][i] = i + baseForSegment;
            }
        }
    }